

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

int ReadFile(string *path,string *contents,string *err)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  int *piVar3;
  stat st;
  char buf [65536];
  
  __stream = fopen((path->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    piVar3 = __errno_location();
    strerror(*piVar3);
    std::__cxx11::string::assign((char *)err);
    iVar1 = -*piVar3;
  }
  else {
    iVar1 = fileno(__stream);
    iVar1 = fstat(iVar1,(stat *)&st);
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      strerror(*piVar3);
      std::__cxx11::string::assign((char *)err);
      fclose(__stream);
      iVar1 = -*piVar3;
    }
    else {
      std::__cxx11::string::reserve((ulong)contents);
      while( true ) {
        iVar1 = feof(__stream);
        if (iVar1 != 0) break;
        sVar2 = fread(buf,1,0x10000,__stream);
        if (sVar2 == 0) break;
        std::__cxx11::string::append((char *)contents,(ulong)buf);
      }
      iVar1 = ferror(__stream);
      if (iVar1 == 0) {
        fclose(__stream);
        iVar1 = 0;
      }
      else {
        piVar3 = __errno_location();
        strerror(*piVar3);
        std::__cxx11::string::assign((char *)err);
        contents->_M_string_length = 0;
        *(contents->_M_dataplus)._M_p = '\0';
        fclose(__stream);
        iVar1 = -*piVar3;
      }
    }
  }
  return iVar1;
}

Assistant:

int ReadFile(const string& path, string* contents, string* err) {
#ifdef _WIN32
  // This makes a ninja run on a set of 1500 manifest files about 4% faster
  // than using the generic fopen code below.
  err->clear();
  HANDLE f = ::CreateFileA(path.c_str(), GENERIC_READ, FILE_SHARE_READ, NULL,
                           OPEN_EXISTING, FILE_FLAG_SEQUENTIAL_SCAN, NULL);
  if (f == INVALID_HANDLE_VALUE) {
    err->assign(GetLastErrorString());
    return -ENOENT;
  }

  for (;;) {
    DWORD len;
    char buf[64 << 10];
    if (!::ReadFile(f, buf, sizeof(buf), &len, NULL)) {
      err->assign(GetLastErrorString());
      contents->clear();
      ::CloseHandle(f);
      return -EIO;
    }
    if (len == 0)
      break;
    contents->append(buf, len);
  }
  ::CloseHandle(f);
  return 0;
#else
  FILE* f = fopen(path.c_str(), "rb");
  if (!f) {
    err->assign(strerror(errno));
    return -errno;
  }

  struct stat st;
  if (fstat(fileno(f), &st) < 0) {
    err->assign(strerror(errno));
    fclose(f);
    return -errno;
  }

  // +1 is for the resize in ManifestParser::Load
  contents->reserve(st.st_size + 1);

  char buf[64 << 10];
  size_t len;
  while (!feof(f) && (len = fread(buf, 1, sizeof(buf), f)) > 0) {
    contents->append(buf, len);
  }
  if (ferror(f)) {
    err->assign(strerror(errno));  // XXX errno?
    contents->clear();
    fclose(f);
    return -errno;
  }
  fclose(f);
  return 0;
#endif
}